

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.h
# Opt level: O2

void __thiscall sznet::net::KcpTcpEventLoop::assertVessels(KcpTcpEventLoop *this)

{
  size_t sVar1;
  
  sVar1 = (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("m_tcpConnections.size() == m_kcpConnections.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.h"
                  ,0x9f,"void sznet::net::KcpTcpEventLoop::assertVessels()");
  }
  if (sVar1 == (this->m_addrConns)._M_h._M_element_count) {
    if (sVar1 == (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      return;
    }
    __assert_fail("m_tcpConnections.size() == m_crypts.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.h"
                  ,0xa1,"void sznet::net::KcpTcpEventLoop::assertVessels()");
  }
  __assert_fail("m_tcpConnections.size() == m_addrConns.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.h"
                ,0xa0,"void sznet::net::KcpTcpEventLoop::assertVessels()");
}

Assistant:

void assertVessels()
	{
		assert(m_tcpConnections.size() == m_kcpConnections.size());
		assert(m_tcpConnections.size() == m_addrConns.size());
		assert(m_tcpConnections.size() == m_crypts.size());
		assert(m_tcpConnections.size() == m_addrConns.size());
	}